

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ParseContext::
ParseContext<std::basic_string_view<char,std::char_traits<char>>&>
          (ParseContext *this,int depth,bool aliasing,char **start,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  string_view flat;
  char *pcVar1;
  undefined7 in_register_00000011;
  
  (this->super_EpsCopyInputStream).patch_buffer_[8] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[9] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[10] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xb] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xc] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xd] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xe] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xf] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x10] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x11] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x12] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x13] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x14] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x15] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x16] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x17] = '\0';
  (this->super_EpsCopyInputStream).zcis_ = (ZeroCopyInputStream *)0x0;
  (this->super_EpsCopyInputStream).patch_buffer_[0] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[1] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[2] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[3] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[4] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[5] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[6] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[7] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x18] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x19] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1a] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1b] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1c] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1d] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1e] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1f] = '\0';
  (this->super_EpsCopyInputStream).aliasing_ = CONCAT71(in_register_00000011,aliasing) & 0xffffffff;
  (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
  (this->super_EpsCopyInputStream).overall_limit_ = 0x7fffffff;
  this->depth_ = depth;
  this->group_depth_ = -0x80000000;
  (this->data_).pool = (DescriptorPool *)0x0;
  (this->data_).factory = (MessageFactory *)0x0;
  flat._M_len = args->_M_len;
  flat._M_str = args->_M_str;
  pcVar1 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,flat);
  *start = pcVar1;
  return;
}

Assistant:

ParseContext(int depth, bool aliasing, const char** start, T&&... args)
      : EpsCopyInputStream(aliasing), depth_(depth) {
    *start = InitFrom(std::forward<T>(args)...);
  }